

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall tinyusdz::crate::CrateReader::ReadCustomData(CrateReader *this,CustomDataType *d)

{
  bool bVar1;
  ostream *poVar2;
  Value *v;
  mapped_type *this_00;
  string local_c90;
  ostringstream local_c70 [8];
  ostringstream ss_e_6;
  undefined1 local_af8 [8];
  MetaVariable var;
  ostringstream local_aa0 [8];
  ostringstream ss_e_5;
  undefined1 local_928 [8];
  CrateValue value;
  uint64_t saved_position;
  ostringstream local_8e8 [8];
  ostringstream ss_e_4;
  ValueRep local_770;
  ValueRep rep;
  string local_748;
  string local_728 [32];
  ostringstream local_708 [8];
  ostringstream ss_e_3;
  string local_590;
  ostringstream local_570 [8];
  ostringstream ss_e_2;
  int64_t local_3f8;
  int64_t offset;
  ostringstream local_3d0 [8];
  ostringstream ss_e_1;
  undefined1 local_258 [8];
  string key;
  __cxx11 local_218 [32];
  __cxx11 local_1f8 [32];
  ostringstream local_1d8 [8];
  ostringstream ss_e;
  ulong local_58;
  uint64_t sz;
  CustomDataType dict;
  CustomDataType *d_local;
  CrateReader *this_local;
  
  dict._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)d;
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
         *)&sz);
  bVar1 = StreamReader::read8(this->_sr,&local_58);
  if (bVar1) {
    if ((this->_config).maxDictElements < local_58) {
      ::std::__cxx11::ostringstream::ostringstream(local_1d8);
      poVar2 = ::std::operator<<((ostream *)local_1d8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,"[Crate]");
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadCustomData");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x6dc);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_1d8,
                                 "The number of elements for Dictionary data is too large. Max = ");
      std::__cxx11::to_string(local_1f8,(this->_config).maxDictElements);
      poVar2 = ::std::operator<<(poVar2,(string *)local_1f8);
      poVar2 = ::std::operator<<(poVar2,", but got ");
      std::__cxx11::to_string(local_218,local_58);
      poVar2 = ::std::operator<<(poVar2,(string *)local_218);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_218);
      ::std::__cxx11::string::~string((string *)local_1f8);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)((long)&key.field_2 + 8));
      ::std::__cxx11::string::~string((string *)(key.field_2._M_local_buf + 8));
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_1d8);
    }
    else {
      do {
        if (local_58 == 0) {
          local_58 = local_58 - 1;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
          ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                       *)dict._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                       *)&sz);
          this_local._7_1_ = 1;
          break;
        }
        local_58 = local_58 - 1;
        ::std::__cxx11::string::string((string *)local_258);
        bVar1 = ReadString(this,(string *)local_258);
        if (bVar1) {
          local_3f8 = 0;
          bVar1 = StreamReader::read8(this->_sr,&local_3f8);
          if (bVar1) {
            bVar1 = StreamReader::seek_from_current(this->_sr,local_3f8 + -8);
            if (bVar1) {
              memset(&local_770,0,8);
              bVar1 = ReadValueRep(this,&local_770);
              if (bVar1) {
                value.value_.v_.vtable = (vtable_type *)StreamReader::tell(this->_sr);
                CrateValue::CrateValue((CrateValue *)local_928);
                bVar1 = UnpackValueRep(this,&local_770,(CrateValue *)local_928);
                if (bVar1) {
                  ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                  ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                           *)&sz,(key_type_conflict *)local_258);
                  MetaVariable::MetaVariable((MetaVariable *)local_af8);
                  v = CrateValue::get_raw((CrateValue *)local_928);
                  MetaVariable::set_value<tinyusdz::value::Value>
                            ((MetaVariable *)local_af8,(string *)local_258,v);
                  this_00 = ::std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                          *)&sz,(key_type_conflict *)local_258);
                  MetaVariable::operator=(this_00,(MetaVariable *)local_af8);
                  bVar1 = StreamReader::seek_set(this->_sr,(uint64_t)value.value_.v_.vtable);
                  if (!bVar1) {
                    ::std::__cxx11::ostringstream::ostringstream(local_c70);
                    poVar2 = ::std::operator<<((ostream *)local_c70,"[error]");
                    poVar2 = ::std::operator<<(poVar2,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                              );
                    poVar2 = ::std::operator<<(poVar2,"[Crate]");
                    poVar2 = ::std::operator<<(poVar2,":");
                    poVar2 = ::std::operator<<(poVar2,"ReadCustomData");
                    poVar2 = ::std::operator<<(poVar2,"():");
                    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x710);
                    ::std::operator<<(poVar2," ");
                    poVar2 = ::std::operator<<((ostream *)local_c70,"Failed to set seek.");
                    ::std::operator<<(poVar2,"\n");
                    ::std::__cxx11::ostringstream::str();
                    PushError(this,&local_c90);
                    ::std::__cxx11::string::~string((string *)&local_c90);
                    this_local._7_1_ = 0;
                    ::std::__cxx11::ostringstream::~ostringstream(local_c70);
                  }
                  bVar1 = !bVar1;
                  MetaVariable::~MetaVariable((MetaVariable *)local_af8);
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream(local_aa0);
                  poVar2 = ::std::operator<<((ostream *)local_aa0,"[error]");
                  poVar2 = ::std::operator<<(poVar2,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                            );
                  poVar2 = ::std::operator<<(poVar2,"[Crate]");
                  poVar2 = ::std::operator<<(poVar2,":");
                  poVar2 = ::std::operator<<(poVar2,"ReadCustomData");
                  poVar2 = ::std::operator<<(poVar2,"():");
                  poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x702);
                  ::std::operator<<(poVar2," ");
                  poVar2 = ::std::operator<<((ostream *)local_aa0,
                                             "Failed to unpack value of Dictionary element.");
                  ::std::operator<<(poVar2,"\n");
                  ::std::__cxx11::ostringstream::str();
                  PushError(this,(string *)((long)&var._name.field_2 + 8));
                  ::std::__cxx11::string::~string((string *)(var._name.field_2._M_local_buf + 8));
                  this_local._7_1_ = 0;
                  bVar1 = true;
                  ::std::__cxx11::ostringstream::~ostringstream(local_aa0);
                }
                CrateValue::~CrateValue((CrateValue *)local_928);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_8e8);
                poVar2 = ::std::operator<<((ostream *)local_8e8,"[error]");
                poVar2 = ::std::operator<<(poVar2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                          );
                poVar2 = ::std::operator<<(poVar2,"[Crate]");
                poVar2 = ::std::operator<<(poVar2,":");
                poVar2 = ::std::operator<<(poVar2,"ReadCustomData");
                poVar2 = ::std::operator<<(poVar2,"():");
                poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x6f9);
                ::std::operator<<(poVar2," ");
                poVar2 = ::std::operator<<((ostream *)local_8e8,
                                           "Failed to read value for Dictionary element.");
                ::std::operator<<(poVar2,"\n");
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&saved_position);
                ::std::__cxx11::string::~string((string *)&saved_position);
                this_local._7_1_ = 0;
                bVar1 = true;
                ::std::__cxx11::ostringstream::~ostringstream(local_8e8);
              }
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_708);
              poVar2 = ::std::operator<<((ostream *)local_708,"[error]");
              poVar2 = ::std::operator<<(poVar2,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar2 = ::std::operator<<(poVar2,"[Crate]");
              poVar2 = ::std::operator<<(poVar2,":");
              poVar2 = ::std::operator<<(poVar2,"ReadCustomData");
              poVar2 = ::std::operator<<(poVar2,"():");
              poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x6f2);
              ::std::operator<<(poVar2," ");
              ::std::__cxx11::to_string(&local_748,local_3f8);
              ::std::operator+((char *)local_728,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               "Failed to seek. Invalid offset value: ");
              poVar2 = ::std::operator<<((ostream *)local_708,local_728);
              ::std::operator<<(poVar2,"\n");
              ::std::__cxx11::string::~string(local_728);
              ::std::__cxx11::string::~string((string *)&local_748);
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)&rep);
              ::std::__cxx11::string::~string((string *)&rep);
              this_local._7_1_ = 0;
              bVar1 = true;
              ::std::__cxx11::ostringstream::~ostringstream(local_708);
            }
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_570);
            poVar2 = ::std::operator<<((ostream *)local_570,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,"[Crate]");
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ReadCustomData");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x6ed);
            ::std::operator<<(poVar2," ");
            poVar2 = ::std::operator<<((ostream *)local_570,
                                       "Failed to read the offset for value in Dictionary.");
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,&local_590);
            ::std::__cxx11::string::~string((string *)&local_590);
            this_local._7_1_ = 0;
            bVar1 = true;
            ::std::__cxx11::ostringstream::~ostringstream(local_570);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_3d0);
          poVar2 = ::std::operator<<((ostream *)local_3d0,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,"[Crate]");
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ReadCustomData");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x6e6);
          ::std::operator<<(poVar2," ");
          poVar2 = ::std::operator<<((ostream *)local_3d0,
                                     "Failed to read key string for Dictionary element.");
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)&offset);
          ::std::__cxx11::string::~string((string *)&offset);
          this_local._7_1_ = 0;
          bVar1 = true;
          ::std::__cxx11::ostringstream::~ostringstream(local_3d0);
        }
        ::std::__cxx11::string::~string((string *)local_258);
      } while (!bVar1);
    }
  }
  else {
    ::std::__cxx11::string::operator+=
              ((string *)&this->_err,"Failed to read the number of elements for Dictionary data.\n")
    ;
    this_local._7_1_ = 0;
  }
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
          *)&sz);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CrateReader::ReadCustomData(CustomDataType *d) {
  CustomDataType dict;
  uint64_t sz;
  if (!_sr->read8(&sz)) {
    _err += "Failed to read the number of elements for Dictionary data.\n";
    return false;
  }

  if (sz > _config.maxDictElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "The number of elements for Dictionary data is too large. Max = " << std::to_string(_config.maxDictElements) << ", but got " << std::to_string(sz));
  }

  DCOUT("# o elements in dict" << sz);

  while (sz--) {
    // key(StringIndex)
    std::string key;

    if (!ReadString(&key)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read key string for Dictionary element.");
    }

    // 8byte for the offset for recursive value. See RecursiveRead() in
    // crateFile.cpp for details.
    int64_t offset{0};
    if (!_sr->read8(&offset)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the offset for value in Dictionary.");
    }

    // -8 to compensate sizeof(offset)
    if (!_sr->seek_from_current(offset - 8)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to seek. Invalid offset value: " + std::to_string(offset));
    }

    DCOUT("key = " << key);

    crate::ValueRep rep{0};
    if (!ReadValueRep(&rep)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read value for Dictionary element.");
    }

    DCOUT("vrep =" << crate::GetCrateDataTypeName(rep.GetType()));

    auto saved_position = _sr->tell();

    crate::CrateValue value;
    if (!UnpackValueRep(rep, &value)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to unpack value of Dictionary element.");
    }

    if (dict.count(key)) {
      // Duplicated key. maybe ok?
    }
    // CrateValue -> MetaVariable
    MetaVariable var;

    var.set_value(key, value.get_raw());

    dict[key] = var;

    if (!_sr->seek_set(saved_position)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to set seek.");
    }
  }

  (*d) = std::move(dict);
  return true;
}